

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O3

RecordField * anon_unknown.dwarf_9a855::GetRecordField(ID *id,Env *env)

{
  RecordField *pRVar1;
  Exception *this;
  string local_40;
  
  pRVar1 = (RecordField *)Env::GetField(env,id);
  if (((pRVar1->super_Field).tof_ | FLOW_FIELD) == RECORD_FIELD) {
    return pRVar1;
  }
  this = (Exception *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"not a record field","");
  Exception::Exception(this,&id->super_Object,&local_40);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

RecordField* GetRecordField(const ID* id, Env* env)
	{
	Field* field = env->GetField(id);
	ASSERT(field);
	if ( field->tof() != RECORD_FIELD && field->tof() != PADDING_FIELD )
		throw Exception(id, "not a record field");
	RecordField* r = static_cast<RecordField*>(field);
	ASSERT(r);
	return r;
	}